

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O0

uint * meshopt::hashLookup<unsigned_int,meshopt::VertexHasher>
                 (uint *table,size_t buckets,VertexHasher *hash,uint *key,uint *empty)

{
  bool bVar1;
  VertexHasher *this;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  uint *item;
  size_t probe;
  size_t bucket;
  size_t hashmod;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  VertexHasher *in_stack_ffffffffffffffb0;
  ulong local_48;
  ulong local_40;
  
  local_40 = VertexHasher::hash(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_48 = 0;
  while( true ) {
    local_40 = local_40 & in_RSI - 1U;
    if (in_RSI - 1U < local_48) {
      return (uint *)0x0;
    }
    this = (VertexHasher *)(in_RDI + local_40 * 4);
    if (*(int *)&this->vertices == *in_R8) break;
    bVar1 = VertexHasher::equal(this,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if (bVar1) {
      return (uint *)this;
    }
    local_40 = local_40 + local_48 + 1;
    local_48 = local_48 + 1;
  }
  return (uint *)this;
}

Assistant:

static T* hashLookup(T* table, size_t buckets, const Hash& hash, const T& key, const T& empty)
{
	assert(buckets > 0);
	assert((buckets & (buckets - 1)) == 0);

	size_t hashmod = buckets - 1;
	size_t bucket = hash.hash(key) & hashmod;

	for (size_t probe = 0; probe <= hashmod; ++probe)
	{
		T& item = table[bucket];

		if (item == empty)
			return &item;

		if (hash.equal(item, key))
			return &item;

		// hash collision, quadratic probing
		bucket = (bucket + probe + 1) & hashmod;
	}

	assert(false && "Hash table is full"); // unreachable
	return 0;
}